

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

cmInstallFilesGenerator *
CreateInstallFilesGenerator
          (cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles,cmInstallCommandArguments *args,bool programs)

{
  bool exclude_from_all;
  bool optional;
  MessageLevel message_00;
  cmInstallFilesGenerator *this;
  char *dest;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *rename;
  MessageLevel message;
  bool programs_local;
  cmInstallCommandArguments *args_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *absFiles_local;
  cmMakefile *mf_local;
  
  message_00 = cmInstallGenerator::SelectMessageLevel(mf,false);
  this = (cmInstallFilesGenerator *)operator_new(0x120);
  cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
  dest = (char *)std::__cxx11::string::c_str();
  cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (char *)std::__cxx11::string::c_str();
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  component = (char *)std::__cxx11::string::c_str();
  exclude_from_all = cmInstallCommandArguments::GetExcludeFromAll(args);
  cmInstallCommandArguments::GetRename_abi_cxx11_(args);
  rename = (char *)std::__cxx11::string::c_str();
  optional = cmInstallCommandArguments::GetOptional(args);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this,absFiles,dest,programs,file_permissions,configurations,component,message_00,
             exclude_from_all,rename,optional);
  return this;
}

Assistant:

static cmInstallFilesGenerator* CreateInstallFilesGenerator(
  cmMakefile* mf, const std::vector<std::string>& absFiles,
  const cmInstallCommandArguments& args, bool programs)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(mf);
  return new cmInstallFilesGenerator(
    absFiles, args.GetDestination().c_str(), programs,
    args.GetPermissions().c_str(), args.GetConfigurations(),
    args.GetComponent().c_str(), message, args.GetExcludeFromAll(),
    args.GetRename().c_str(), args.GetOptional());
}